

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O1

Error __thiscall asmjit::CodeHolder::relocateToBase(CodeHolder *this,uint64_t baseAddress)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  size_type sVar4;
  Value VVar5;
  void *pvVar6;
  CodeHolder *pCVar7;
  Slot *pSVar8;
  Slot *pSVar9;
  undefined1 uVar10;
  Error EVar11;
  ulong uVar12;
  undefined4 extraout_var;
  uint8_t *puVar13;
  byte bVar14;
  byte bVar15;
  AddressTableEntry *pAVar16;
  CodeBuffer *out;
  ulong uVar17;
  uint64_t *extraout_RDX;
  uint64_t *extraout_RDX_00;
  uint64_t *out_00;
  uint8_t *puVar18;
  Value unaff_RBX;
  ulong unaff_RBP;
  CodeBuffer *pCVar19;
  CodeHolder *pCVar20;
  uint uVar21;
  long lVar22;
  Value unaff_R12;
  long lVar23;
  CodeBuffer *unaff_R13;
  undefined8 unaff_R14;
  undefined7 uVar24;
  CodeHolder *unaff_R15;
  bool bVar25;
  bool bVar26;
  uint64_t value;
  CodeBuffer *pCStack_d8;
  ulong uStack_d0;
  ulong uStack_c8;
  CodeBuffer *pCStack_c0;
  Value VStack_b8;
  Value VStack_b0;
  char cStack_a8;
  undefined7 uStack_a7;
  ulong uStack_a0;
  CodeHolder *pCStack_98;
  code *pcStack_90;
  byte local_79;
  CodeBuffer *local_78;
  CodeHolder *local_70;
  Value local_68;
  Value local_60;
  uint64_t local_58;
  CodeHolder *local_50;
  uint8_t *local_48;
  ulong local_40;
  uint8_t *local_38;
  
  if (baseAddress == 0xffffffffffffffff) {
LAB_00115b69:
    local_78 = (CodeBuffer *)0x2;
LAB_00115b2e:
    return (Error)local_78;
  }
  this->_baseAddress = baseAddress;
  bVar14 = (this->_environment)._arch;
  uVar17 = CONCAT71((int7)((ulong)unaff_R14 >> 8),bVar14);
  VVar5 = (Value)this->_addressTableSection;
  local_78 = (CodeBuffer *)0x0;
  pCVar19 = (CodeBuffer *)baseAddress;
  pCVar20 = this;
  if ((Section *)VVar5.constant == (Section *)0x0) {
    puVar13 = (uint8_t *)0x0;
  }
  else {
    unaff_R13 = (CodeBuffer *)(VVar5.constant + 0x48);
    if ((*(size_t *)(VVar5.constant + 0x58) < (VVar5.label)->_offset) &&
       (local_78 = (CodeBuffer *)0x9, (*(byte *)(VVar5.constant + 0x60) & 2) == 0)) {
      pcStack_90 = (code *)0x115b51;
      pCVar19 = unaff_R13;
      EVar11 = CodeHolder_reserveInternal(this,unaff_R13,(VVar5.label)->_offset);
      local_78 = (CodeBuffer *)CONCAT44(extraout_var,EVar11);
      unaff_RBX = VVar5;
      unaff_R12.constant = baseAddress;
      unaff_R15 = this;
    }
    if ((int)local_78 != 0) goto LAB_00115b2e;
    puVar13 = unaff_R13->_data;
  }
  uVar12 = (ulong)(this->_relocations).super_ZoneVectorBase._size;
  bVar25 = uVar12 == 0;
  if (bVar25) {
    local_60.constant = 0;
  }
  else {
    unaff_RBX = (Value)(this->_relocations).super_ZoneVectorBase._data;
    local_38 = (unaff_RBX.expression)->valueType + uVar12 * 8 + -1;
    local_40 = (ulong)(bVar14 & 1) ^ 3;
    local_60.constant = 0;
    local_79 = bVar14;
    local_58 = baseAddress;
    local_50 = this;
    local_48 = puVar13;
    do {
      unaff_R12.constant = *unaff_RBX.constant;
      iVar2 = *(int *)((unaff_R12.expression)->reserved + 1);
      if (iVar2 == 0) {
        unaff_R15 = (CodeHolder *)0x5;
        goto LAB_00115ac4;
      }
      uVar21 = (this->_sections).super_ZoneVectorBase._size;
      if (uVar21 <= *(uint *)((unaff_R12.expression)->value + 1)) {
        pcStack_90 = (code *)0x115b64;
        relocateToBase();
LAB_00115b64:
        pcStack_90 = (code *)0x115b69;
        relocateToBase();
        goto LAB_00115b69;
      }
      pvVar6 = (this->_sections).super_ZoneVectorBase._data;
      lVar23 = *(long *)((long)pvVar6 + (ulong)*(uint *)((unaff_R12.expression)->value + 1) * 8);
      uVar3 = (unaff_R12.label)->_parentId;
      if ((ulong)uVar3 == 0xffffffff) {
        lVar22 = 0;
      }
      else {
        if (uVar21 <= uVar3) goto LAB_00115b64;
        lVar22 = *(long *)((long)pvVar6 + (ulong)uVar3 * 8);
      }
      pCVar20 = (CodeHolder *)(unaff_R12.label)->_section;
      uVar12 = (unaff_R12.label)->_offset;
      unaff_R15 = (CodeHolder *)0x1;
      pCVar19 = (CodeBuffer *)(*(ulong *)(lVar23 + 0x50) - uVar12);
      local_70 = pCVar20;
      if (((*(ulong *)(lVar23 + 0x50) < uVar12 || pCVar19 == (CodeBuffer *)0x0) ||
          (out = (CodeBuffer *)(ulong)*(byte *)((long)(unaff_R12.expression)->value + 2),
          pCVar19 < out)) || (4 < iVar2 - 1U)) {
switchD_00115a79_caseD_3:
        local_78 = (CodeBuffer *)0x18;
      }
      else {
        pCVar19 = *(CodeBuffer **)(lVar23 + 0x10);
        local_68 = (Value)((Value *)(lVar23 + 0x48))->expression;
        unaff_RBP = *(byte *)((long)(unaff_R12.expression)->value + 4) + uVar12;
        switch(iVar2) {
        case 1:
          pcStack_90 = (code *)0x1158a7;
          EVar11 = CodeHolder_evaluateExpression(pCVar20,(Expression *)&local_70,(uint64_t *)out);
          bVar26 = EVar11 == 0;
          pCVar19 = (CodeBuffer *)((ulong)local_78 & 0xffffffff);
          if (!bVar26) {
            pCVar19 = (CodeBuffer *)(ulong)EVar11;
          }
          uVar24 = (undefined7)((ulong)VVar5 >> 8);
          this = local_50;
          local_78 = pCVar19;
          if (bVar26) {
            uVar17 = CONCAT71(uVar24,local_79);
            break;
          }
          unaff_R15 = (CodeHolder *)(ulong)((uint)bVar26 * 5 + 1);
          uVar17 = CONCAT71(uVar24,local_79);
          goto LAB_00115ac4;
        case 3:
          if (lVar22 == 0) goto switchD_00115a79_caseD_3;
          pCVar20 = (CodeHolder *)
                    ((long)(pCVar20->_allocator)._slots +
                    *(long *)(lVar22 + 0x10) + local_58 + -0x48);
          local_70 = pCVar20;
          break;
        case 4:
          pCVar19 = (CodeBuffer *)((long)&pCVar19->_data + local_58);
          local_70 = (CodeHolder *)
                     ((long)pCVar20 - ((long)&pCVar19->_data + (long)&out->_data + uVar12));
          pCVar20 = local_70;
          if (((uVar17 & 1) == 0) &&
             (pCVar20 = (CodeHolder *)((ulong)&local_70[0x6bca1a]._addressTableSection >> 0x20),
             pCVar20 != (CodeHolder *)0x0)) {
            local_78 = (CodeBuffer *)0x19;
            goto LAB_00115ac4;
          }
          break;
        case 5:
          if ((unaff_RBP < 2) || (*(char *)((long)(unaff_R12.expression)->value + 3) != '\x04'))
          goto switchD_00115a79_caseD_3;
          local_70 = (CodeHolder *)
                     ((long)pCVar20 -
                     ((long)&out->_data + (long)&pCVar19->_data + local_58 + uVar12));
          if ((CodeHolder *)(long)(int)local_70 != local_70) {
            for (pAVar16 = (this->_addressTableEntries)._root; pAVar16 != (AddressTableEntry *)0x0;
                pAVar16 = (AddressTableEntry *)
                          ((pAVar16->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).
                           super_ZoneTreeNode._rbNodeData[uVar21 >> 0x1f] & 0xfffffffffffffffe)) {
              pCVar7 = (CodeHolder *)pAVar16->_address;
              uVar21 = (uint)(pCVar7 >= pCVar20 && pCVar7 != pCVar20) - (uint)(pCVar7 < pCVar20);
              if (uVar21 == 0) goto LAB_001159b7;
            }
            pAVar16 = (AddressTableEntry *)0x0;
LAB_001159b7:
            if (pAVar16 == (AddressTableEntry *)0x0) {
LAB_00115a2c:
              bVar26 = false;
              local_78 = (CodeBuffer *)0x18;
            }
            else {
              if ((Section *)VVar5.constant == (Section *)0x0) goto LAB_00115b75;
              if (pAVar16->_slot == 0xffffffff) {
                pAVar16->_slot = (uint32_t)local_60.constant;
                local_60._0_4_ = (uint32_t)local_60.constant + 1;
                local_60.constant._4_4_ = 0;
              }
              pCVar20 = (CodeHolder *)((ulong)pAVar16->_slot << ((byte)local_40 & 0x3f));
              local_70 = (CodeHolder *)
                         (((long)(VVar5.expression)->value[1].expression -
                          ((long)&out->_data + (long)&pCVar19->_data + uVar12)) + (long)pCVar20);
              if ((CodeHolder *)(long)(int)local_70 == local_70) {
                cVar1 = *(char *)((local_68.constant - 1) + unaff_RBP);
                if (cVar1 == -0x18) {
                  uVar10 = 0x15;
                }
                else {
                  if (cVar1 != -0x17) goto LAB_00115a2c;
                  uVar10 = 0x25;
                }
                *(undefined1 *)((local_68.constant - 2) + unaff_RBP) = 0xff;
                *(undefined1 *)((local_68.constant - 1) + unaff_RBP) = uVar10;
                *(Section **)(local_48 + -0x40 + (long)((pCVar20->_allocator)._slots + -1)) =
                     (unaff_R12.label)->_section;
                bVar26 = true;
              }
              else {
                local_78 = (CodeBuffer *)0x19;
                bVar26 = false;
              }
            }
            if (!bVar26) goto LAB_00115ac4;
          }
        }
        pCVar7 = local_70;
        switch(*(undefined1 *)((long)(unaff_R12.expression)->value + 3)) {
        case 1:
          (local_68.expression)->valueType[unaff_RBP - 1] = (uint8_t)local_70;
          break;
        case 2:
          ((local_68.expression)->valueType + (unaff_RBP - 1))[0] = (uint8_t)local_70;
          ((local_68.expression)->valueType + (unaff_RBP - 1))[1] = local_70._1_1_;
          break;
        default:
          goto switchD_00115a79_caseD_3;
        case 4:
          *(undefined4 *)((local_68.expression)->valueType + (unaff_RBP - 1)) = local_70._0_4_;
          break;
        case 8:
          *(CodeHolder **)((local_68.expression)->valueType + (unaff_RBP - 1)) = local_70;
        }
        unaff_R15 = (CodeHolder *)0x0;
        local_70 = pCVar7;
      }
LAB_00115ac4:
      if (((int)unaff_R15 != 5) && ((int)unaff_R15 != 0)) break;
      unaff_RBX.expression = (Expression *)(unaff_RBX.expression)->value;
      bVar25 = (uint8_t *)unaff_RBX.constant == local_38;
    } while (!bVar25);
  }
  if (bVar25 == false) goto LAB_00115b2e;
  sVar4 = (this->_sectionsByOrder).super_ZoneVectorBase._size;
  if (sVar4 != 0) {
    local_78 = (CodeBuffer *)0x0;
    if (*(Section **)
         ((long)(this->_sectionsByOrder).super_ZoneVectorBase._data + (ulong)(sVar4 - 1) * 8) ==
        (Section *)VVar5.constant) {
      uVar17 = (ulong)(uint)((int)local_60.constant << ((byte)uVar17 & 1 ^ 3));
      *(ulong *)(VVar5.constant + 0x50) = uVar17;
      (VVar5.label)->_offset = uVar17;
    }
    goto LAB_00115b2e;
  }
  pcStack_90 = (code *)0x115b75;
  relocateToBase();
LAB_00115b75:
  pcStack_90 = CodeHolder_evaluateExpression;
  relocateToBase();
  lVar23 = 1;
  bVar26 = false;
  out_00 = extraout_RDX;
  pCStack_d8 = pCVar19;
  VStack_b8 = unaff_RBX;
  VStack_b0 = unaff_R12;
  uStack_a0 = uVar17;
  pCStack_98 = unaff_R15;
  pcStack_90 = (code *)unaff_RBP;
  cStack_a8 = bVar25;
  uStack_a7 = (int7)((ulong)unaff_R13 >> 8);
  do {
    switch(*(undefined1 *)((long)(pCVar20->_allocator)._slots + lVar23 + -0x48)) {
    case 0:
      pCStack_c0 = (CodeBuffer *)0x0;
      break;
    case 1:
      pCStack_c0 = (CodeBuffer *)(pCVar20->_allocator)._slots[lVar23 + -9];
      break;
    case 2:
      pSVar8 = (pCVar20->_allocator)._slots[lVar23 + -9];
      pSVar9 = pSVar8[4].next;
      if (pSVar9 != (Slot *)0x0) {
        pCStack_c0 = (CodeBuffer *)((long)&(pSVar9[2].next)->next + (long)&(pSVar8[3].next)->next);
        break;
      }
      unaff_RBP = 0x43;
LAB_00115c21:
      bVar25 = false;
      goto LAB_00115c23;
    case 3:
      EVar11 = CodeHolder_evaluateExpression
                         ((CodeHolder *)(pCVar20->_allocator)._slots[lVar23 + -9],
                          (Expression *)&pCStack_c0,out_00);
      unaff_RBP = unaff_RBP & 0xffffffff;
      out_00 = extraout_RDX_00;
      if (EVar11 != 0) {
        unaff_RBP = (ulong)EVar11;
        goto LAB_00115c21;
      }
      break;
    default:
      bVar25 = false;
      unaff_RBP = 3;
      goto LAB_00115c23;
    }
    (&pCStack_d8)[lVar23] = pCStack_c0;
    bVar25 = true;
LAB_00115c23:
    if (!bVar25) break;
    lVar23 = lVar23 + 1;
    bVar26 = lVar23 != 2;
  } while (lVar23 == 2);
  if (!bVar26) {
    return (Error)unaff_RBP;
  }
  bVar14 = (byte)uStack_c8;
  switch((pCVar20->_environment)._arch) {
  case '\0':
    puVar13 = (uint8_t *)(uStack_c8 + uStack_d0);
    break;
  case '\x01':
    puVar13 = (uint8_t *)(uStack_d0 - uStack_c8);
    break;
  case '\x02':
    puVar13 = (uint8_t *)(uStack_c8 * uStack_d0);
    break;
  case '\x03':
    puVar18 = (uint8_t *)(uStack_d0 << (bVar14 & 0x3f));
    goto LAB_00115c95;
  case '\x04':
    puVar18 = (uint8_t *)(uStack_d0 >> (bVar14 & 0x3f));
LAB_00115c95:
    puVar13 = (uint8_t *)0x0;
    if (uStack_c8 < 0x40) {
      puVar13 = puVar18;
    }
    break;
  case '\x05':
    bVar15 = 0x3f;
    if (uStack_c8 < 0x3f) {
      bVar15 = bVar14;
    }
    puVar13 = (uint8_t *)((long)uStack_d0 >> (bVar15 & 0x3f));
    break;
  default:
    return 3;
  }
  pCStack_d8->_data = puVar13;
  return 0;
}

Assistant:

Error CodeHolder::relocateToBase(uint64_t baseAddress) noexcept {
  // Base address must be provided.
  if (ASMJIT_UNLIKELY(baseAddress == Globals::kNoBaseAddress))
    return DebugUtils::errored(kErrorInvalidArgument);

  _baseAddress = baseAddress;
  uint32_t addressSize = _environment.registerSize();

  Section* addressTableSection = _addressTableSection;
  uint32_t addressTableEntryCount = 0;
  uint8_t* addressTableEntryData = nullptr;

  if (addressTableSection) {
    ASMJIT_PROPAGATE(
      reserveBuffer(&addressTableSection->_buffer, size_t(addressTableSection->virtualSize())));
    addressTableEntryData = addressTableSection->_buffer.data();
  }

  // Relocate all recorded locations.
  for (const RelocEntry* re : _relocations) {
    // Possibly deleted or optimized-out entry.
    if (re->relocType() == RelocEntry::kTypeNone)
      continue;

    Section* sourceSection = sectionById(re->sourceSectionId());
    Section* targetSection = nullptr;

    if (re->targetSectionId() != Globals::kInvalidId)
      targetSection = sectionById(re->targetSectionId());

    uint64_t value = re->payload();
    uint64_t sectionOffset = sourceSection->offset();
    uint64_t sourceOffset = re->sourceOffset();

    // Make sure that the `RelocEntry` doesn't go out of bounds.
    size_t regionSize = re->format().regionSize();
    if (ASMJIT_UNLIKELY(re->sourceOffset() >= sourceSection->bufferSize() ||
                        sourceSection->bufferSize() - size_t(re->sourceOffset()) < regionSize))
      return DebugUtils::errored(kErrorInvalidRelocEntry);

    uint8_t* buffer = sourceSection->data();
    size_t valueOffset = size_t(re->sourceOffset()) + re->format().valueOffset();

    switch (re->relocType()) {
      case RelocEntry::kTypeExpression: {
        Expression* expression = (Expression*)(uintptr_t(value));
        ASMJIT_PROPAGATE(CodeHolder_evaluateExpression(this, expression, &value));
        break;
      }

      case RelocEntry::kTypeAbsToAbs: {
        break;
      }

      case RelocEntry::kTypeRelToAbs: {
        // Value is currently a relative offset from the start of its section.
        // We have to convert it to an absolute offset (including base address).
        if (ASMJIT_UNLIKELY(!targetSection))
          return DebugUtils::errored(kErrorInvalidRelocEntry);

        //value += baseAddress + sectionOffset + sourceOffset + regionSize;
        value += baseAddress + targetSection->offset();
        break;
      }

      case RelocEntry::kTypeAbsToRel: {
        value -= baseAddress + sectionOffset + sourceOffset + regionSize;
        if (addressSize > 4 && !Support::isInt32(int64_t(value)))
          return DebugUtils::errored(kErrorRelocOffsetOutOfRange);
        break;
      }

      case RelocEntry::kTypeX64AddressEntry: {
        if (re->format().valueSize() != 4 || valueOffset < 2)
          return DebugUtils::errored(kErrorInvalidRelocEntry);

        // First try whether a relative 32-bit displacement would work.
        value -= baseAddress + sectionOffset + sourceOffset + regionSize;
        if (!Support::isInt32(int64_t(value))) {
          // Relative 32-bit displacement is not possible, use '.addrtab' section.
          AddressTableEntry* atEntry = _addressTableEntries.get(re->payload());
          if (ASMJIT_UNLIKELY(!atEntry))
            return DebugUtils::errored(kErrorInvalidRelocEntry);

          // Cannot be null as we have just matched the `AddressTableEntry`.
          ASMJIT_ASSERT(addressTableSection != nullptr);

          if (!atEntry->hasAssignedSlot())
            atEntry->_slot = addressTableEntryCount++;

          size_t atEntryIndex = size_t(atEntry->slot()) * addressSize;
          uint64_t addrSrc = sectionOffset + sourceOffset + regionSize;
          uint64_t addrDst = addressTableSection->offset() + uint64_t(atEntryIndex);

          value = addrDst - addrSrc;
          if (!Support::isInt32(int64_t(value)))
            return DebugUtils::errored(kErrorRelocOffsetOutOfRange);

          // Bytes that replace [REX, OPCODE] bytes.
          uint32_t byte0 = 0xFF;
          uint32_t byte1 = buffer[valueOffset - 1];

          if (byte1 == 0xE8) {
            // Patch CALL/MOD byte to FF /2 (-> 0x15).
            byte1 = x86EncodeMod(0, 2, 5);
          }
          else if (byte1 == 0xE9) {
            // Patch JMP/MOD byte to FF /4 (-> 0x25).
            byte1 = x86EncodeMod(0, 4, 5);
          }
          else {
            return DebugUtils::errored(kErrorInvalidRelocEntry);
          }

          // Patch `jmp/call` instruction.
          buffer[valueOffset - 2] = uint8_t(byte0);
          buffer[valueOffset - 1] = uint8_t(byte1);

          Support::writeU64uLE(addressTableEntryData + atEntryIndex, re->payload());
        }
        break;
      }

      default:
        return DebugUtils::errored(kErrorInvalidRelocEntry);
    }

    switch (re->format().valueSize()) {
      case 1:
        Support::writeU8(buffer + valueOffset, uint32_t(value & 0xFFu));
        break;

      case 2:
        Support::writeU16uLE(buffer + valueOffset, uint32_t(value & 0xFFFFu));
        break;

      case 4:
        Support::writeU32uLE(buffer + valueOffset, uint32_t(value & 0xFFFFFFFFu));
        break;

      case 8:
        Support::writeU64uLE(buffer + valueOffset, value);
        break;

      default:
        return DebugUtils::errored(kErrorInvalidRelocEntry);
    }
  }

  // Fixup the virtual size of the address table if it's the last section.
  if (_sectionsByOrder.last() == addressTableSection) {
    size_t addressTableSize = addressTableEntryCount * addressSize;
    addressTableSection->_buffer._size = addressTableSize;
    addressTableSection->_virtualSize = addressTableSize;
  }

  return kErrorOk;
}